

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_statistics(roaring_bitmap_t *r,roaring_statistics_t *stat)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  run_container_t *run;
  long lVar7;
  
  stat->sum_value = 0;
  stat->cardinality = 0;
  stat->n_bytes_run_containers = 0;
  stat->n_bytes_bitset_containers = 0;
  stat->max_value = 0;
  stat->min_value = 0;
  stat->n_values_array_containers = 0;
  stat->n_values_run_containers = 0;
  stat->n_values_bitset_containers = 0;
  stat->n_bytes_array_containers = 0;
  stat->n_containers = 0;
  stat->n_array_containers = 0;
  stat->n_run_containers = 0;
  stat->n_bitset_containers = 0;
  stat->n_containers = (r->high_low_container).size;
  uVar3 = roaring_bitmap_minimum(r);
  stat->min_value = uVar3;
  uVar3 = roaring_bitmap_maximum(r);
  stat->max_value = uVar3;
  if (0 < (r->high_low_container).size) {
    lVar7 = 0;
    do {
      run = (run_container_t *)(r->high_low_container).containers[lVar7];
      uVar2 = (r->high_low_container).typecodes[lVar7];
      uVar1 = uVar2;
      if (uVar2 == '\x04') {
        uVar1 = *(uint8_t *)&run->runs;
        uVar2 = *(uint8_t *)&run->runs;
        run = *(run_container_t **)run;
      }
      if (uVar2 == '\x03') {
        uVar4 = run_container_cardinality(run);
      }
      else {
        uVar4 = run->n_runs;
      }
      piVar6 = (int *)(r->high_low_container).containers[lVar7];
      uVar2 = (r->high_low_container).typecodes[lVar7];
      if (uVar2 == '\x04') {
        uVar2 = (uint8_t)piVar6[2];
        piVar6 = *(int **)piVar6;
      }
      if (uVar2 == '\x01') {
        iVar5 = 0x2000;
      }
      else if (uVar2 == '\x03') {
        iVar5 = *piVar6 * 4 + 2;
      }
      else {
        iVar5 = *piVar6 * 2;
      }
      stat->cardinality = stat->cardinality + (ulong)uVar4;
      if (uVar1 == '\x03') {
        stat->n_run_containers = stat->n_run_containers + 1;
        stat->n_values_run_containers = stat->n_values_run_containers + uVar4;
        stat->n_bytes_run_containers = stat->n_bytes_run_containers + iVar5;
      }
      else if (uVar1 == '\x02') {
        stat->n_array_containers = stat->n_array_containers + 1;
        stat->n_values_array_containers = stat->n_values_array_containers + uVar4;
        stat->n_bytes_array_containers = stat->n_bytes_array_containers + iVar5;
      }
      else {
        stat->n_bitset_containers = stat->n_bitset_containers + 1;
        stat->n_values_bitset_containers = stat->n_values_bitset_containers + uVar4;
        stat->n_bytes_bitset_containers = stat->n_bytes_bitset_containers + iVar5;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (r->high_low_container).size);
  }
  return;
}

Assistant:

void roaring_bitmap_statistics(const roaring_bitmap_t *r,
                               roaring_statistics_t *stat) {
    const roaring_array_t *ra = &r->high_low_container;

    memset(stat, 0, sizeof(*stat));
    stat->n_containers = ra->size;
    stat->min_value = roaring_bitmap_minimum(r);
    stat->max_value = roaring_bitmap_maximum(r);

    for (int i = 0; i < ra->size; ++i) {
        uint8_t truetype =
            get_container_type(ra->containers[i], ra->typecodes[i]);
        uint32_t card =
            container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        uint32_t sbytes =
            container_size_in_bytes(ra->containers[i], ra->typecodes[i]);
        stat->cardinality += card;
        switch (truetype) {
            case BITSET_CONTAINER_TYPE:
                stat->n_bitset_containers++;
                stat->n_values_bitset_containers += card;
                stat->n_bytes_bitset_containers += sbytes;
                break;
            case ARRAY_CONTAINER_TYPE:
                stat->n_array_containers++;
                stat->n_values_array_containers += card;
                stat->n_bytes_array_containers += sbytes;
                break;
            case RUN_CONTAINER_TYPE:
                stat->n_run_containers++;
                stat->n_values_run_containers += card;
                stat->n_bytes_run_containers += sbytes;
                break;
            default:
                assert(false);
                roaring_unreachable;
        }
    }
}